

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

boolean occupied(level *lev,xchar x,xchar y)

{
  boolean bVar1;
  trap *ptVar2;
  int y_00;
  undefined7 in_register_00000011;
  int x_00;
  undefined7 in_register_00000031;
  bool bVar3;
  
  y_00 = (int)CONCAT71(in_register_00000011,y);
  x_00 = (int)CONCAT71(in_register_00000031,x);
  ptVar2 = t_at(lev,x_00,y_00);
  bVar3 = true;
  if ((ptVar2 == (trap *)0x0) && (7 < (byte)(lev->locations[x][y].typ - 0x1aU))) {
    bVar1 = is_lava(lev,x_00,y_00);
    if (bVar1 == '\0') {
      bVar1 = is_pool(lev,x_00,y_00);
      if (bVar1 == '\0') {
        bVar1 = invocation_pos(&lev->z,x,y);
        bVar3 = bVar1 != '\0';
      }
    }
  }
  return bVar3;
}

Assistant:

boolean occupied(struct level *lev, xchar x, xchar y)
{
	return((boolean)(t_at(lev, x, y)
		|| IS_FURNITURE(lev->locations[x][y].typ)
		|| is_lava(lev, x, y)
		|| is_pool(lev, x, y)
		|| invocation_pos(&lev->z, x, y)
		));
}